

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeKRMmatricesGlobal
          (ChElementShellReissner4 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor
          )

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ChMatrixNM<double,_24,_24> *pCVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value != 0x18) ||
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != 0x18)) {
    __assert_fail("(H.rows() == 24) && (H.cols() == 24)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellReissner4.cpp"
                  ,0x268,
                  "virtual void chrono::fea::ChElementShellReissner4::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  ComputeMassMatrix(this);
  ComputeInternalJacobians(this,Kfactor,Rfactor);
  pCVar7 = &this->m_JacobianMatrix;
  uVar2 = (H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value;
  lVar4 = 0;
  uVar5 = 0;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = Mfactor;
  while (uVar5 != (~((long)uVar2 >> 0x3f) & uVar2)) {
    uVar3 = (H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value;
    uVar6 = 0;
    do {
      if ((~((long)uVar3 >> 0x3f) & uVar3) == uVar6) goto LAB_007a5ea5;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = pCVar7[-1].super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                     m_storage.m_data.array[uVar6];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (pCVar7->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).
                     m_storage.m_data.array[uVar6];
      auVar1 = vfmadd213sd_fma(auVar8,auVar9,auVar1);
      *(long *)((long)(H->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      ).
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      .
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_data +
               uVar6 * 8 +
               (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).m_stride.m_outer.m_value * lVar4) = auVar1._0_8_;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x18);
    uVar5 = uVar5 + 1;
    pCVar7 = (ChMatrixNM<double,_24,_24> *)
             ((pCVar7->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.
              m_data.array + 0x18);
    lVar4 = lVar4 + 8;
    if (uVar5 == 0x18) {
      return;
    }
  }
LAB_007a5ea5:
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
               );
}

Assistant:

void ChElementShellReissner4::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 24) && (H.cols() == 24));

    // Calculate the mass matrix
    ComputeMassMatrix();

    // Calculate the linear combination Kfactor*[K] + Rfactor*[R]
    ComputeInternalJacobians(Kfactor, Rfactor);

    // Load Jac + Mfactor*[M] into H
    for (int i = 0; i < 24; i++)
        for (int j = 0; j < 24; j++)
            H(i, j) = m_JacobianMatrix(i, j) + Mfactor * m_MassMatrix(i, j);
}